

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O3

int rb_compare_lists(lyd_node *n1,lyd_node *n2)

{
  long lVar1;
  int iVar2;
  lys_module *plVar3;
  long lVar4;
  long lVar5;
  
  if ((n1->schema->nodetype & 0x10) == 0) {
    __assert_fail("n1->schema->nodetype & LYS_LIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0xf2,"int rb_compare_lists(const struct lyd_node *, const struct lyd_node *)");
  }
  if ((n2->schema->nodetype & 0x10) == 0) {
    __assert_fail("n2->schema->nodetype & LYS_LIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0xf3,"int rb_compare_lists(const struct lyd_node *, const struct lyd_node *)");
  }
  lVar4 = *(long *)(n1 + 1);
  lVar5 = *(long *)(n2 + 1);
  iVar2 = rb_sort_clb(n1->schema->module->ctx,(lyd_value *)(lVar4 + 0x38),
                      (lyd_value *)(lVar5 + 0x38));
  if (iVar2 == 0) {
    do {
      lVar4 = *(long *)(lVar4 + 0x18);
      if (lVar4 == 0) {
        return 0;
      }
      lVar1 = *(long *)(lVar4 + 8);
      if (lVar1 == 0) {
        return 0;
      }
      if ((*(byte *)(lVar1 + 3) & 1) == 0) {
        return 0;
      }
      lVar5 = *(long *)(lVar5 + 0x18);
      if (lVar1 != *(long *)(lVar5 + 8)) {
        __assert_fail("k1->schema == k2->schema",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                      ,0x103,
                      "int rb_compare_lists(const struct lyd_node *, const struct lyd_node *)");
      }
      plVar3 = (lys_module *)&n1[2].schema;
      if (n1->schema != (lysc_node *)0x0) {
        plVar3 = n1->schema->module;
      }
      iVar2 = rb_sort_clb(plVar3->ctx,(lyd_value *)(lVar4 + 0x38),(lyd_value *)(lVar5 + 0x38));
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

static int
rb_compare_lists(const struct lyd_node *n1, const struct lyd_node *n2)
{
    const struct lyd_node *k1, *k2;
    struct lyd_value *val1, *val2;
    int cmp;

    /* compare first list key */
    assert(n1->schema->nodetype & LYS_LIST);
    assert(n2->schema->nodetype & LYS_LIST);

    /* lyd_child() is not called due to optimization */
    k1 = ((const struct lyd_node_inner *)n1)->child;
    k2 = ((const struct lyd_node_inner *)n2)->child;
    val1 = &((struct lyd_node_term *)k1)->value;
    val2 = &((struct lyd_node_term *)k2)->value;
    cmp = rb_sort_clb(LYD_CTX(n1), val1, val2);
    if (cmp != 0) {
        return cmp;
    }

    /* continue with the next keys */
    k1 = k1->next;
    k2 = k2->next;
    while (k1 && k1->schema && (k1->schema->flags & LYS_KEY)) {
        assert(k1->schema == k2->schema);
        val1 = &((struct lyd_node_term *)k1)->value;
        val2 = &((struct lyd_node_term *)k2)->value;
        cmp = rb_sort_clb(LYD_CTX(n1), val1, val2);
        if (cmp != 0) {
            return cmp;
        }
        k1 = k1->next;
        k2 = k2->next;
    }
    return cmp;
}